

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

DWORD __thiscall FNodeBuilder::SplitSeg(FNodeBuilder *this,DWORD segnum,int splitvert,int v1InFront)

{
  int iVar1;
  DWORD DVar2;
  uint uVar3;
  FPrivSeg *pFVar4;
  FPrivVert *pFVar5;
  undefined1 local_78 [4];
  int newnum;
  FPrivSeg newseg;
  double dy;
  double dx;
  int v1InFront_local;
  int splitvert_local;
  DWORD segnum_local;
  FNodeBuilder *this_local;
  
  uVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
  pFVar4 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                     (&this->Segs,(ulong)segnum);
  memcpy(local_78,pFVar4,0x48);
  TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
            (&this->Vertices,(long)splitvert);
  TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
            (&this->Vertices,(long)(int)local_78);
  pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)splitvert);
  iVar1 = (pFVar5->super_FSimpleVert).y;
  pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)(int)local_78);
  newseg.hashnext = (FPrivSeg *)(double)(iVar1 - (pFVar5->super_FSimpleVert).y);
  if (v1InFront < 1) {
    pFVar4 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)segnum);
    pFVar4->v1 = splitvert;
    newnum = splitvert;
    RemoveSegFromVert1(this,segnum,(int)local_78);
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)(int)local_78);
    newseg.backsector._4_4_ = pFVar5->segs;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)(int)local_78);
    pFVar5->segs = uVar3;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)splitvert);
    newseg.next = pFVar5->segs2;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)splitvert);
    pFVar5->segs2 = uVar3;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)splitvert);
    DVar2 = pFVar5->segs;
    pFVar4 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)segnum);
    pFVar4->nextforvert = DVar2;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)splitvert);
    pFVar5->segs = segnum;
  }
  else {
    local_78 = (undefined1  [4])splitvert;
    pFVar4 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)segnum);
    pFVar4->v2 = splitvert;
    RemoveSegFromVert2(this,segnum,newnum);
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)splitvert);
    newseg.backsector._4_4_ = pFVar5->segs;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)splitvert);
    pFVar5->segs = uVar3;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)newnum);
    newseg.next = pFVar5->segs2;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)newnum);
    pFVar5->segs2 = uVar3;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)splitvert);
    DVar2 = pFVar5->segs2;
    pFVar4 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)segnum);
    pFVar4->nextforvert2 = DVar2;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)splitvert);
    pFVar5->segs2 = segnum;
  }
  TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Push(&this->Segs,(FPrivSeg *)local_78);
  return uVar3;
}

Assistant:

DWORD FNodeBuilder::SplitSeg (DWORD segnum, int splitvert, int v1InFront)
{
	double dx, dy;
	FPrivSeg newseg;
	int newnum = (int)Segs.Size();

	newseg = Segs[segnum];
	dx = double(Vertices[splitvert].x - Vertices[newseg.v1].x);
	dy = double(Vertices[splitvert].y - Vertices[newseg.v1].y);
	if (v1InFront > 0)
	{
		newseg.v1 = splitvert;
		Segs[segnum].v2 = splitvert;

		RemoveSegFromVert2 (segnum, newseg.v2);

		newseg.nextforvert = Vertices[splitvert].segs;
		Vertices[splitvert].segs = newnum;

		newseg.nextforvert2 = Vertices[newseg.v2].segs2;
		Vertices[newseg.v2].segs2 = newnum;

		Segs[segnum].nextforvert2 = Vertices[splitvert].segs2;
		Vertices[splitvert].segs2 = segnum;
	}
	else
	{
		Segs[segnum].v1 = splitvert;
		newseg.v2 = splitvert;

		RemoveSegFromVert1 (segnum, newseg.v1);

		newseg.nextforvert = Vertices[newseg.v1].segs;
		Vertices[newseg.v1].segs = newnum;

		newseg.nextforvert2 = Vertices[splitvert].segs2;
		Vertices[splitvert].segs2 = newnum;

		Segs[segnum].nextforvert = Vertices[splitvert].segs;
		Vertices[splitvert].segs = segnum;
	}

	Segs.Push (newseg);

	D(Printf (PRINT_LOG, "Split seg %d to get seg %d\n", segnum, newnum));

	return newnum;
}